

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

int nni_dialer_setopt(nni_dialer *d,char *name,void *val,size_t sz,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *p_Var1;
  int iVar2;
  nni_option *pnVar3;
  
  iVar2 = strcmp(name,"reconnect-time-max");
  if (iVar2 == 0) {
    nni_mtx_lock(&d->d_mtx);
    iVar2 = nni_copyin_ms(&d->d_maxrtime,val,sz,t);
    nni_mtx_unlock(&d->d_mtx);
  }
  else {
    iVar2 = strcmp(name,"reconnect-time-min");
    if (iVar2 == 0) {
      nni_mtx_lock(&d->d_mtx);
      iVar2 = nni_copyin_ms(&d->d_inirtime,val,sz,t);
      if (iVar2 == 0) {
        d->d_currtime = d->d_inirtime;
      }
      nni_mtx_unlock(&d->d_mtx);
    }
    else {
      p_Var1 = (d->d_ops).d_setopt;
      if ((p_Var1 == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) ||
         (iVar2 = (*p_Var1)(d->d_data,name,val,sz,t), iVar2 == 9)) {
        pnVar3 = (d->d_ops).d_options;
        while( true ) {
          if (pnVar3 == (nni_option *)0x0) {
            return 9;
          }
          if (pnVar3->o_name == (char *)0x0) {
            return 9;
          }
          iVar2 = strcmp(pnVar3->o_name,name);
          if (iVar2 == 0) break;
          pnVar3 = pnVar3 + 1;
        }
        if (pnVar3->o_set != (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
          iVar2 = (*pnVar3->o_set)(d->d_data,val,sz,t);
          return iVar2;
        }
        iVar2 = 0x18;
      }
    }
  }
  return iVar2;
}

Assistant:

int
nni_dialer_setopt(
    nni_dialer *d, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_option *o;

	if (strcmp(name, NNG_OPT_RECONNMAXT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyin_ms(&d->d_maxrtime, val, sz, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}
	if (strcmp(name, NNG_OPT_RECONNMINT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyin_ms(&d->d_inirtime, val, sz, t);
		if (rv == 0) {
			d->d_currtime = d->d_inirtime;
		}
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}

	if (d->d_ops.d_setopt != NULL) {
		int rv = d->d_ops.d_setopt(d->d_data, name, val, sz, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = d->d_ops.d_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_set == NULL) {
			return (NNG_EREADONLY);
		}

		return (o->o_set(d->d_data, val, sz, t));
	}

	return (NNG_ENOTSUP);
}